

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_lea(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  uint uVar2;
  uintptr_t o_1;
  TCGv_i32 pTVar3;
  TCGv_i32 *ppTVar4;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = insn >> 9 & 7;
  ppTVar4 = s->writeback;
  if (((uint)s->writeback_mask >> uVar2 & 1) == 0) {
    ppTVar4 = tcg_ctx->cpu_aregs;
  }
  pTVar1 = ppTVar4[uVar2];
  pTVar3 = gen_lea_mode(env,s,insn >> 3 & 7,insn & 7,2);
  if (pTVar3 != tcg_ctx->NULL_QREG) {
    if (pTVar1 != pTVar3) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar1 + (long)tcg_ctx),
                       (TCGArg)(pTVar3 + (long)tcg_ctx));
      return;
    }
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(lea)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;

    reg = AREG(insn, 9);
    tmp = gen_lea(env, s, insn, OS_LONG);
    if (IS_NULL_QREG(tmp)) {
        gen_addr_fault(s);
        return;
    }
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
}